

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclareFixture.hpp
# Opt level: O0

int __thiscall
ut11::detail::DeclareFixtureObj<IsTrueTests>::operator()<>
          (DeclareFixtureObj<IsTrueTests> *this,Category *category)

{
  IsTrueTests *this_00;
  TestFixture *this_01;
  pointer pIVar1;
  shared_ptr<ut11::detail::TestFixtureAbstract> local_c0;
  Category local_b0;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [48];
  unique_ptr<IsTrueTests,_std::default_delete<IsTrueTests>_> local_20;
  unique_ptr<IsTrueTests,_std::default_delete<IsTrueTests>_> fixture;
  Category *category_local;
  DeclareFixtureObj<IsTrueTests> *this_local;
  
  fixture._M_t.super___uniq_ptr_impl<IsTrueTests,_std::default_delete<IsTrueTests>_>._M_t.
  super__Tuple_impl<0UL,_IsTrueTests_*,_std::default_delete<IsTrueTests>_>.
  super__Head_base<0UL,_IsTrueTests_*,_false>._M_head_impl =
       (__uniq_ptr_data<IsTrueTests,_std::default_delete<IsTrueTests>,_true,_true>)
       (__uniq_ptr_data<IsTrueTests,_std::default_delete<IsTrueTests>,_true,_true>)category;
  this_00 = (IsTrueTests *)operator_new(0x60);
  (this_00->super_TestFixture).m_categories._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  (this_00->super_TestFixture).m_categories._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->super_TestFixture).m_categories._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this_00->super_TestFixture).m_categories._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  *(undefined8 *)&(this_00->super_TestFixture).m_categories._M_t._M_impl = 0;
  *(undefined8 *)
   &(this_00->super_TestFixture).m_categories._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(undefined8 *)&(this_00->super_TestFixture).field_0x20 = 0;
  (this_00->super_TestFixture).m_StageBuilder._M_t.
  super___uniq_ptr_impl<ut11::detail::TestStageBuilder,_std::default_delete<ut11::detail::TestStageBuilder>_>
  ._M_t.
  super__Tuple_impl<0UL,_ut11::detail::TestStageBuilder_*,_std::default_delete<ut11::detail::TestStageBuilder>_>
  .super__Head_base<0UL,_ut11::detail::TestStageBuilder_*,_false>._M_head_impl =
       (TestStageBuilder *)0x0;
  *(undefined8 *)&(this_00->super_TestFixture).field_0x10 = 0;
  *(undefined8 *)&(this_00->super_TestFixture).field_0x18 = 0;
  (this_00->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract =
       (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_TestFixture).m_name = 0;
  IsTrueTests::IsTrueTests(this_00);
  std::unique_ptr<IsTrueTests,std::default_delete<IsTrueTests>>::
  unique_ptr<std::default_delete<IsTrueTests>,void>
            ((unique_ptr<IsTrueTests,std::default_delete<IsTrueTests>> *)&local_20,this_00);
  this_01 = &std::unique_ptr<IsTrueTests,_std::default_delete<IsTrueTests>_>::operator->(&local_20)
             ->super_TestFixture;
  std::operator+(local_70,(char *)this);
  GetString_abi_cxx11_();
  std::operator+(local_50,local_70);
  TestFixture::SetName(this_01,local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)local_70);
  pIVar1 = std::unique_ptr<IsTrueTests,_std::default_delete<IsTrueTests>_>::operator->(&local_20);
  Category::Category(&local_b0,category);
  (*(pIVar1->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[2])
            (pIVar1,&local_b0);
  Category::~Category(&local_b0);
  std::shared_ptr<ut11::detail::TestFixtureAbstract>::
  shared_ptr<IsTrueTests,std::default_delete<IsTrueTests>,void>(&local_c0,&local_20);
  PushFixture(&local_c0);
  std::shared_ptr<ut11::detail::TestFixtureAbstract>::~shared_ptr(&local_c0);
  std::unique_ptr<IsTrueTests,_std::default_delete<IsTrueTests>_>::~unique_ptr(&local_20);
  return 0;
}

Assistant:

int operator()(Category category, ARGS && ... args)
			{
				std::unique_ptr<T> fixture(new T(std::forward<ARGS>(args)...));
				fixture->SetName(m_name + "(" + GetString(args...));
				fixture->AddCategory(category);

				PushFixture(std::move(fixture));
				return 0;
			}